

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::SerializeWithCachedSizes
          (ItemSimilarityRecommender_SimilarItems *this,CodedOutputStream *output)

{
  uint uVar1;
  uint64 uVar2;
  ItemSimilarityRecommender_ConnectedItem *value;
  double dVar3;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ItemSimilarityRecommender_SimilarItems *this_local;
  
  uVar2 = itemid(this);
  if (uVar2 != 0) {
    uVar2 = itemid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  local_20 = 0;
  uVar1 = similaritemlist_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = similaritemlist(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value->super_MessageLite,output);
  }
  dVar3 = itemscoreadjustment(this);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar3 = itemscoreadjustment(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(3,dVar3,output);
  }
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 itemId = 1;
  if (this->itemid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->itemid(), output);
  }

  // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
  for (unsigned int i = 0, n = this->similaritemlist_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->similaritemlist(i), output);
  }

  // double itemScoreAdjustment = 3;
  if (this->itemscoreadjustment() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(3, this->itemscoreadjustment(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
}